

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

upb_MiniTableField * upb_MiniTable_FindFieldByNumber(upb_MiniTable *m,uint32_t number)

{
  uint uVar1;
  ulong uVar2;
  upb_MiniTableField *puVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  uVar2 = (ulong)number - 1;
  uVar5 = (ulong)m->dense_below_dont_copy_me__upb_internal_use_only;
  if (uVar2 < uVar5) {
    if (m->fields_dont_copy_me__upb_internal_use_only[uVar2].
        number_dont_copy_me__upb_internal_use_only != number) {
      __assert_fail("m->fields_dont_copy_me__upb_internal_use_only[i].number_dont_copy_me__upb_internal_use_only == number"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/message.c"
                    ,0x18,
                    "const upb_MiniTableField *upb_MiniTable_FindFieldByNumber(const upb_MiniTable *, uint32_t)"
                   );
    }
    puVar3 = m->fields_dont_copy_me__upb_internal_use_only + uVar2;
  }
  else {
    iVar6 = m->field_count_dont_copy_me__upb_internal_use_only - 1;
    do {
      uVar4 = (uint)uVar5;
      if (iVar6 < (int)uVar4) {
        return (upb_MiniTableField *)0x0;
      }
      uVar7 = uVar4 + iVar6 >> 1;
      uVar1 = m->fields_dont_copy_me__upb_internal_use_only[uVar7].
              number_dont_copy_me__upb_internal_use_only;
      uVar8 = uVar7 + 1;
      if (number <= uVar1) {
        iVar6 = uVar7 - 1;
        uVar8 = uVar4;
      }
      uVar5 = (ulong)uVar8;
    } while (uVar1 != number);
    puVar3 = m->fields_dont_copy_me__upb_internal_use_only + uVar7;
  }
  return puVar3;
}

Assistant:

const upb_MiniTableField* upb_MiniTable_FindFieldByNumber(
    const upb_MiniTable* m, uint32_t number) {
  const size_t i = ((size_t)number) - 1;  // 0 wraps to SIZE_MAX

  // Ideal case: index into dense fields
  if (i < m->UPB_PRIVATE(dense_below)) {
    UPB_ASSERT(m->UPB_PRIVATE(fields)[i].UPB_PRIVATE(number) == number);
    return &m->UPB_PRIVATE(fields)[i];
  }

  // Slow case: binary search
  uint32_t lo = m->UPB_PRIVATE(dense_below);
  int32_t hi = m->UPB_PRIVATE(field_count) - 1;
  const upb_MiniTableField* base = m->UPB_PRIVATE(fields);
  while (hi >= (int32_t)lo) {
    uint32_t mid = (hi + lo) / 2;
    uint32_t num = base[mid].UPB_ONLYBITS(number);
    // These comparison operations allow, on ARM machines, to fuse all these
    // branches into one comparison followed by two CSELs to set the lo/hi
    // values, followed by a BNE to continue or terminate the loop. Since binary
    // search branches are generally unpredictable (50/50 in each direction),
    // this is a good deal. We use signed for the high, as this decrement may
    // underflow if mid is 0.
    int32_t hi_mid = mid - 1;
    uint32_t lo_mid = mid + 1;
    if (num == number) {
      return &base[mid];
    }
    if (UPB_UNPREDICTABLE(num < number)) {
      lo = lo_mid;
    } else {
      hi = hi_mid;
    }
  }

  return NULL;
}